

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O2

void __thiscall AmstradCPC::CRTCBusHandler::set_colour(CRTCBusHandler *this,uint8_t colour)

{
  if (((long)this->pen_ & 0x10U) == 0) {
    this->palette_[this->pen_] = (&DAT_00448750)[colour];
    patch_mode_table(this,(long)this->pen_);
    return;
  }
  if (this->previous_output_mode_ == Border) {
    output_border(this,this->cycles_);
    this->cycles_ = 0;
  }
  this->border_ = (&DAT_00448750)[colour];
  return;
}

Assistant:

void set_colour(uint8_t colour) {
			if(pen_ & 16) {
				// If border is[/was] currently being output, flush what should have been
				// drawn in the old colour.
				if(previous_output_mode_ == OutputMode::Border) {
					output_border(cycles_);
					cycles_ = 0;
				}
				border_ = mapped_palette_value(colour);
			} else {
				palette_[pen_] = mapped_palette_value(colour);
				patch_mode_table(size_t(pen_));
			}
		}